

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot-brdf.cpp
# Opt level: O3

void mouseMotionCallback(GLFWwindow *window,double x,double y)

{
  double dVar1;
  double dVar2;
  float_t fVar3;
  float_t fVar4;
  float_t fVar5;
  int iVar6;
  ImGuiIO *pIVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  mat3 local_60;
  mat3 local_3c;
  
  dVar1 = x - mouseMotionCallback::x0;
  dVar2 = y - mouseMotionCallback::y0;
  pIVar7 = ImGui::GetIO();
  if (pIVar7->WantCaptureMouse == false) {
    iVar6 = glfwGetMouseButton(window,0);
    fVar4 = g_camera.axis.m[1].y;
    if (iVar6 == 1) {
      fVar3 = g_camera.axis.m[0].y;
      fVar5 = g_camera.axis.m[2].y;
      fVar8 = (float)(dVar1 * 0.005) * 0.5;
      fVar9 = cosf(fVar8);
      local_60.m[1].x = sinf(fVar8);
      local_60.m[0].y = local_60.m[1].x * 0.0;
      local_60.m[0].x = fVar9;
      local_60.m[0].z = local_60.m[0].y;
      dja::mat3::rotation((quaternion *)&local_60);
      dja::operator*(&local_60,&local_3c,&g_camera.axis);
      g_camera.axis.m[2].z = local_60.m[2].z;
      g_camera.axis.m[0].y = local_60.m[0].y;
      g_camera.axis.m[0].x = local_60.m[0].x;
      g_camera.axis.m[1].y = local_60.m[1].y;
      g_camera.axis.m[1].z = local_60.m[1].z;
      g_camera.axis.m[2].x = local_60.m[2].x;
      g_camera.axis.m[2].y = local_60.m[2].y;
      g_camera.axis.m[0].z = local_60.m[0].z;
      g_camera.axis.m[1].x = local_60.m[1].x;
      fVar8 = (float)(dVar2 * 0.005) * 0.5;
      fVar9 = cosf(fVar8);
      local_60.m[0].z = sinf(fVar8);
      local_60.m[1].x = fVar5 * local_60.m[0].z;
      local_60.m[0].y = local_60.m[0].z * fVar3;
      local_60.m[0].z = local_60.m[0].z * fVar4;
      local_60.m[0].x = fVar9;
      dja::mat3::rotation((quaternion *)&local_60);
      dja::operator*(&local_60,&local_3c,&g_camera.axis);
      g_camera.axis.m[1].y = local_60.m[1].y;
      g_camera.axis.m[1].z = local_60.m[1].z;
      fVar8 = 1.0 / SQRT(local_60.m[0].z * local_60.m[0].z +
                         local_60.m[0].x * local_60.m[0].x + local_60.m[0].y * local_60.m[0].y);
      g_camera.axis.m[0].z = local_60.m[0].z * fVar8;
      g_camera.axis.m[0].x = fVar8 * local_60.m[0].x;
      g_camera.axis.m[0].y = fVar8 * local_60.m[0].y;
      fVar8 = 1.0 / SQRT(g_camera.axis.m[1].z * g_camera.axis.m[1].z +
                         local_60.m[1].x * local_60.m[1].x +
                         g_camera.axis.m[1].y * g_camera.axis.m[1].y);
      g_camera.axis.m[1].z = g_camera.axis.m[1].z * fVar8;
      g_camera.axis.m[1].x = fVar8 * local_60.m[1].x;
      g_camera.axis.m[1].y = fVar8 * g_camera.axis.m[1].y;
      fVar9 = local_60.m[2].x;
      fVar12 = local_60.m[2].y;
      fVar8 = 1.0 / SQRT(local_60.m[2].z * local_60.m[2].z + fVar9 * fVar9 + fVar12 * fVar12);
      g_camera.axis.m[2].z = local_60.m[2].z * fVar8;
      g_camera.axis.m[2].y = fVar8 * fVar12;
      g_camera.axis.m[2].x = fVar8 * fVar9;
    }
    else {
      iVar6 = glfwGetMouseButton(window,1);
      if (iVar6 != 1) {
        mouseMotionCallback::x0 = x;
        mouseMotionCallback::y0 = y;
        return;
      }
      fVar8 = (float)dVar1;
      fVar9 = (float)dVar2;
      fVar10 = g_camera.pos.x;
      fVar11 = g_camera.pos.y;
      fVar12 = SQRT(g_camera.pos.z * g_camera.pos.z + fVar10 * fVar10 + fVar11 * fVar11);
      fVar10 = fVar10 - fVar12 * fVar8 * g_camera.axis.m[0].y * 0.005;
      fVar11 = fVar11 - fVar12 * fVar8 * g_camera.axis.m[1].y * 0.005;
      fVar8 = g_camera.pos.z - g_camera.axis.m[2].y * fVar8 * 0.005 * fVar12;
      fVar12 = SQRT(fVar8 * fVar8 + fVar10 * fVar10 + fVar11 * fVar11);
      g_camera.pos.y = fVar12 * fVar9 * g_camera.axis.m[1].z * 0.005 + fVar11;
      g_camera.pos.x = fVar12 * fVar9 * g_camera.axis.m[0].z * 0.005 + fVar10;
      g_camera.pos.z = g_camera.axis.m[2].z * fVar9 * 0.005 * fVar12 + fVar8;
    }
    g_framebuffer.flags.reset = true;
    mouseMotionCallback::x0 = x;
    mouseMotionCallback::y0 = y;
  }
  return;
}

Assistant:

void mouseMotionCallback(GLFWwindow* window, double x, double y)
{
    static double x0 = 0, y0 = 0;
    double dx = x - x0,
           dy = y - y0;

    ImGuiIO& io = ImGui::GetIO();
    if (io.WantCaptureMouse)
        return;

    if (glfwGetMouseButton(window, GLFW_MOUSE_BUTTON_LEFT) == GLFW_PRESS) {
        dja::mat3 axis = dja::transpose(g_camera.axis);
        g_camera.axis = dja::mat3::rotation(dja::vec3(0, 0, 1), dx * 5e-3)
                      * g_camera.axis;
        g_camera.axis = dja::mat3::rotation(axis[1], dy * 5e-3)
                      * g_camera.axis;
        g_camera.axis[0] = dja::normalize(g_camera.axis[0]);
        g_camera.axis[1] = dja::normalize(g_camera.axis[1]);
        g_camera.axis[2] = dja::normalize(g_camera.axis[2]);
        g_framebuffer.flags.reset = true;
    } else if (glfwGetMouseButton(window, GLFW_MOUSE_BUTTON_RIGHT) == GLFW_PRESS) {
        dja::mat3 axis = dja::transpose(g_camera.axis);
        g_camera.pos-= axis[1] * dx * 5e-3 * norm(g_camera.pos);
        g_camera.pos+= axis[2] * dy * 5e-3 * norm(g_camera.pos);
        g_framebuffer.flags.reset = true;
    }

    x0 = x;
    y0 = y;
}